

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::UniquenessConstraintSyntax::setChild
          (UniquenessConstraintSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  RangeListSyntax *pRVar2;
  Token TVar3;
  
  if (index == 2) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->semi).kind = TVar3.kind;
    (this->semi).field_0x2 = TVar3._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->semi).rawLen = TVar3.rawLen;
    (this->semi).info = TVar3.info;
  }
  else if (index == 1) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pRVar2 = (RangeListSyntax *)0x0;
    }
    else {
      pRVar2 = (RangeListSyntax *)TokenOrSyntax::node(&child);
    }
    (this->ranges).ptr = pRVar2;
  }
  else {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->unique).kind = TVar3.kind;
    (this->unique).field_0x2 = TVar3._2_1_;
    (this->unique).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->unique).rawLen = TVar3.rawLen;
    (this->unique).info = TVar3.info;
  }
  return;
}

Assistant:

void UniquenessConstraintSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: unique = child.token(); return;
        case 1: ranges = child.node() ? &child.node()->as<RangeListSyntax>() : nullptr; return;
        case 2: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}